

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.hpp
# Opt level: O0

void __thiscall antlr::Parser::matchNot(Parser *this,int t)

{
  int iVar1;
  undefined8 uVar2;
  int in_ESI;
  long *in_RDI;
  bool in_stack_00000023;
  int in_stack_00000024;
  RefToken *in_stack_00000028;
  int in_stack_00000034;
  char **in_stack_00000038;
  MismatchedTokenException *in_stack_00000040;
  string *in_stack_00000050;
  undefined1 local_48 [32];
  undefined1 local_28 [28];
  int local_c;
  
  local_c = in_ESI;
  iVar1 = (**(code **)(*in_RDI + 0x10))(in_RDI,1);
  if (iVar1 == local_c) {
    uVar2 = __cxa_allocate_exception(200);
    (**(code **)(*in_RDI + 200))();
    (**(code **)(*in_RDI + 0xd0))();
    (**(code **)(*in_RDI + 0x18))(local_28,in_RDI,1);
    (**(code **)(*in_RDI + 0x40))(local_48);
    MismatchedTokenException::MismatchedTokenException
              (in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000028,
               in_stack_00000024,in_stack_00000023,in_stack_00000050);
    __cxa_throw(uVar2,&MismatchedTokenException::typeinfo,
                MismatchedTokenException::~MismatchedTokenException);
  }
  (**(code **)(*in_RDI + 0x60))();
  return;
}

Assistant:

virtual void matchNot(int t)
	{
		if ( LA(1)==t )
		{
			// Throws inverted-sense exception
			throw MismatchedTokenException(getTokenNames(), getNumTokens(), LT(1), t, true, getFilename());
		}
		else
		{
			// mark token as consumed -- fetch next token deferred until LA/LT
			consume();
		}
	}